

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

bool __thiscall VcprojGenerator::openOutput(VcprojGenerator *this,QFile *file,QString *param_2)

{
  int iVar1;
  QMakeProject *pQVar2;
  int *piVar3;
  bool bVar4;
  ProKey *this_00;
  char *pcVar5;
  ProKey *this_01;
  long in_FS_OFFSET;
  ProString extension;
  ProString fileName;
  ProKey local_1e8;
  ProKey local_1b8;
  ProKey local_188;
  ProKey local_158;
  ProKey local_128;
  ProString local_f8;
  undefined1 local_c8 [32];
  undefined1 *puStack_a8;
  undefined1 *local_a0;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [4];
  QFlagsStorage<QArrayData::ArrayOption> QStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  this_00 = &local_1e8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (undefined1  [4])0xaaaaaaaa;
  QStack_64.i = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  (**(code **)(*(long *)file + 0xe8))((QString *)local_98);
  ProString::ProString((ProString *)local_68,(QString *)local_98);
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_f8,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_c8,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_f8);
  bVar4 = ProString::operator==((ProString *)local_c8,"vcsubdirs");
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  if (bVar4) {
    pcVar5 = "VCSOLUTION_EXTENSION";
    this_01 = &local_128;
  }
  else {
    pcVar5 = "VCPROJ_EXTENSION";
    this_01 = &local_158;
  }
  ProKey::ProKey(this_01,pcVar5);
  QMakeEvaluator::first((ProString *)local_98,&pQVar2->super_QMakeEvaluator,this_01);
  if (bVar4) {
    if (&(local_128.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_128.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i;
      UNLOCK();
      local_158.super_ProString.m_string.d.d = local_128.super_ProString.m_string.d.d;
joined_r0x002469ce:
      if (iVar1 == 0) {
        QArrayData::deallocate(&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i;
    UNLOCK();
    goto joined_r0x002469ce;
  }
  if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
    }
  }
  if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar4 = ProString::endsWith((ProString *)local_68,(ProString *)local_98,CaseSensitive);
  if (bVar4) goto LAB_00246ab9;
  if (uStack_50._4_4_ == 0) {
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_188,"MAKEFILE");
    QMakeEvaluator::first(&local_f8,&pQVar2->super_QMakeEvaluator,&local_188);
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    if (local_f8.m_length == 0) {
      pcVar5 = "TARGET";
    }
    else {
      pcVar5 = "MAKEFILE";
      this_00 = &local_1b8;
    }
    ProKey::ProKey(this_00,pcVar5);
    QMakeEvaluator::first((ProString *)local_c8,&pQVar2->super_QMakeEvaluator,this_00);
    QString::operator=((QString *)local_68,(QString *)local_c8);
    uStack_50 = (undefined1 *)local_c8._24_8_;
    local_48 = puStack_a8;
    puStack_40 = local_a0;
    if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if (local_f8.m_length == 0) {
      if (&(local_1e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_1e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        iVar1 = ((local_1e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x00246c80;
      }
    }
    else if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i;
      UNLOCK();
      local_1e8.super_ProString.m_string.d.d = local_1b8.super_ProString.m_string.d.d;
joined_r0x00246c80:
      if (iVar1 == 0) {
        QArrayData::deallocate(&(local_1e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_188.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_188.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_f8.m_string.d.d = (Data *)local_68;
  local_f8.m_string.d.ptr = (char16_t *)local_98;
  QStringBuilder<ProString_&,_ProString_&>::convertTo<QString>
            ((QString *)local_c8,(QStringBuilder<ProString_&,_ProString_&> *)&local_f8);
  QFile::setFileName((QString *)file);
  if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
    }
  }
LAB_00246ab9:
  local_c8._0_8_ = (QArrayData *)0x0;
  local_c8._8_8_ = (char16_t *)0x0;
  local_c8._16_8_ = 0;
  bVar4 = MakefileGenerator::openOutput((MakefileGenerator *)this,file,(QString *)local_c8);
  if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  piVar3 = (int *)CONCAT44(QStack_64.i,local_68);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(QStack_64.i,local_68),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool VcprojGenerator::openOutput(QFile &file, const QString &/*build*/) const
{
    ProString fileName = file.fileName();
    ProString extension = project->first("TEMPLATE") == "vcsubdirs"
            ? project->first("VCSOLUTION_EXTENSION") : project->first("VCPROJ_EXTENSION");
    if (!fileName.endsWith(extension)) {
        if (fileName.isEmpty()) {
            fileName = !project->first("MAKEFILE").isEmpty()
                    ? project->first("MAKEFILE") : project->first("TARGET");
        }
        file.setFileName(fileName + extension);
    }
    return Win32MakefileGenerator::openOutput(file, QString());
}